

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void MirrorUVRow_C(uint8_t *src_uv,uint8_t *dst_uv,int width)

{
  long lVar1;
  uint8_t *puVar2;
  
  if (0 < width) {
    puVar2 = src_uv + (width * 2 + -2);
    lVar1 = 0;
    do {
      dst_uv[lVar1 * 2] = *puVar2;
      dst_uv[lVar1 * 2 + 1] = puVar2[1];
      lVar1 = lVar1 + 1;
      puVar2 = puVar2 + -2;
    } while (width != (int)lVar1);
  }
  return;
}

Assistant:

void MirrorUVRow_C(const uint8_t* src_uv, uint8_t* dst_uv, int width) {
  int x;
  src_uv += (width - 1) << 1;
  for (x = 0; x < width; ++x) {
    dst_uv[0] = src_uv[0];
    dst_uv[1] = src_uv[1];
    src_uv -= 2;
    dst_uv += 2;
  }
}